

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_locate.c
# Opt level: O0

mpt_node * mpt_node_locate(mpt_node *curr,int pos,void *ident,size_t len,int charset)

{
  int iVar1;
  int *piVar2;
  void *pvVar3;
  ulong local_50;
  size_t idlen;
  size_t clen;
  char *cid;
  int charset_local;
  size_t len_local;
  void *ident_local;
  mpt_node *pmStack_18;
  int pos_local;
  mpt_node *curr_local;
  
  if ((curr == (mpt_node *)0x0) || ((len != 0 && (ident == (void *)0x0)))) {
    piVar2 = __errno_location();
    *piVar2 = 0xe;
    return (mpt_node *)0x0;
  }
  local_50 = len;
  cid._4_4_ = charset;
  if (charset < 0) {
    cid._4_4_ = 1;
    local_50 = len + 1;
  }
  ident_local._4_4_ = pos;
  pmStack_18 = curr;
  if (pos == 0) {
    for (; pmStack_18->next != (mpt_node *)0x0; pmStack_18 = pmStack_18->next) {
    }
    if (cid._4_4_ == (pmStack_18->ident)._charset) {
      if ((cid._4_4_ == 0) || (local_50 != 0)) {
        pvVar3 = mpt_identifier_data(&pmStack_18->ident);
        if (((local_50 == (pmStack_18->ident)._len) &&
            ((local_50 == len || (*(char *)((long)pvVar3 + len) == '\0')))) &&
           ((len == 0 || (iVar1 = memcmp(ident,pvVar3,len), iVar1 == 0)))) {
          return pmStack_18;
        }
      }
      else if ((pmStack_18->ident)._base == (char *)ident) {
        return pmStack_18;
      }
    }
    ident_local._4_4_ = -1;
  }
  if (ident_local._4_4_ < 0) {
    do {
      while( true ) {
        do {
          pmStack_18 = pmStack_18->prev;
          if (pmStack_18 == (mpt_node *)0x0) {
            return (mpt_node *)0x0;
          }
        } while (cid._4_4_ != (pmStack_18->ident)._charset);
        if ((cid._4_4_ == 0) || (local_50 != 0)) break;
        if ((((pmStack_18->ident)._len == 0) && ((pmStack_18->ident)._base == (char *)ident)) &&
           (ident_local._4_4_ = ident_local._4_4_ + 1, ident_local._4_4_ == 0)) {
          return pmStack_18;
        }
      }
      pvVar3 = mpt_identifier_data(&pmStack_18->ident);
    } while ((((local_50 != (pmStack_18->ident)._len) ||
              ((local_50 != len && (*(char *)((long)pvVar3 + len) != '\0')))) ||
             ((len != 0 && (iVar1 = memcmp(ident,pvVar3,len), iVar1 != 0)))) ||
            (ident_local._4_4_ = ident_local._4_4_ + 1, curr_local = pmStack_18,
            ident_local._4_4_ != 0));
  }
  else {
    do {
      if (cid._4_4_ == (pmStack_18->ident)._charset) {
        if ((cid._4_4_ == 0) || (local_50 != 0)) {
          pvVar3 = mpt_identifier_data(&pmStack_18->ident);
          if (((local_50 == (pmStack_18->ident)._len) &&
              ((local_50 == len || (*(char *)((long)pvVar3 + len) == '\0')))) &&
             ((len == 0 || (iVar1 = memcmp(ident,pvVar3,len), iVar1 == 0))))
          goto joined_r0x00120aea;
        }
        else if ((pmStack_18->ident)._base == (char *)ident) {
joined_r0x00120aea:
          ident_local._4_4_ = ident_local._4_4_ + -1;
          if (ident_local._4_4_ == 0) break;
        }
      }
      pmStack_18 = pmStack_18->next;
    } while (pmStack_18 != (mpt_node *)0x0);
    curr_local = pmStack_18;
  }
  return curr_local;
}

Assistant:

extern MPT_STRUCT(node) *mpt_node_locate(const MPT_STRUCT(node) *curr, int pos, const void *ident, size_t len, int charset)
{
	const char *cid;
	size_t clen, idlen;
	
	/* no matching storage -> no matching node */
	if (!curr || (len && !ident)) {
		errno = EFAULT;
		return 0;
	}
	/* existing identifier type */
	if (charset >= 0) {
		idlen = len;
	}
	/* default identifier type */
	else {
		charset = MPT_CHARSET(UTF8);
		idlen = len + 1;
	}
	/* simple end search, check final for match */
	if (!pos) {
		while (curr->next) {
			curr = curr->next;
		}
		if (charset == curr->ident._charset) {
			if (charset && !idlen) {
				if (curr->ident._base == ident) {
					return (MPT_STRUCT(node) *) curr;
				}
			}
			else {
				cid  = mpt_identifier_data(&curr->ident);
				clen = curr->ident._len;
				if (idlen == clen
				    && (idlen == (size_t) len || !cid[len])
				    && (!len || !memcmp(ident, cid, len))) {
					return (MPT_STRUCT(node) *) curr;
				}
			}
		}
		pos = -1;
	}
	/* negative offset, start with previous */
	if (pos < 0) {
		while ((curr = curr->prev)) {
			if (charset != curr->ident._charset) {
				continue;
			}
			if (charset && !idlen) {
				if (!curr->ident._len
				    && curr->ident._base == ident
				    && !(++pos)) {
					break;
				}
				continue;
			}
			cid  = mpt_identifier_data(&curr->ident);
			clen = curr->ident._len;
			if (idlen == clen
			    && (idlen == (size_t) len || !cid[len])
			    && (!len || !memcmp(ident, cid, len))) {
				if (!(++pos)) {
					break;
				}
			}
		}
		return (MPT_STRUCT(node) *) curr;
	}
	/* positive offset, start with current */
	do {
		if (charset != curr->ident._charset) {
			continue;
		}
		if (charset && !idlen) {
			if (curr->ident._base == ident
			    && !(--pos)) {
				break;
			}
			continue;
		}
		cid  = mpt_identifier_data(&curr->ident);
		clen = curr->ident._len;
		if (idlen == clen
		    && (idlen == (size_t) len || !cid[len])
		    && (!len || !memcmp(ident, cid, len))) {
			if (!(--pos)) {
				break;
			}
		}
	} while ((curr = curr->next));
	
	return (MPT_STRUCT(node) *) curr;
}